

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

void bitset_container_add_from_range
               (bitset_container_t *bitset,uint32_t min,uint32_t max,uint16_t step)

{
  uint uVar1;
  ushort in_CX;
  uint in_EDX;
  uint in_ESI;
  bitset_container_t *in_RDI;
  uint32_t value_1;
  uint32_t i;
  uint32_t endword;
  uint32_t firstword;
  uint32_t value;
  uint64_t mask;
  uint local_34;
  uint local_30;
  uint local_24;
  ulong local_20;
  
  if (in_CX != 0) {
    local_34 = in_ESI;
    if ((int)(0x40 % (ulong)(long)(int)(uint)in_CX) == 0) {
      local_20 = 0;
      for (local_24 = in_ESI % (uint)in_CX; local_24 < 0x40; local_24 = in_CX + local_24) {
        local_20 = 1L << ((byte)local_24 & 0x3f) | local_20;
      }
      local_30 = in_ESI >> 6;
      uVar1 = in_EDX - 1 >> 6;
      in_RDI->cardinality = (((in_EDX - in_ESI) + (uint)in_CX) - 1) / (uint)in_CX;
      if (local_30 == uVar1) {
        in_RDI->words[local_30] =
             local_20 &
             -1L << ((byte)in_ESI & 0x3f) &
             0xffffffffffffffffU >> (((byte)in_EDX ^ 0xff) + 1 & 0x3f) | in_RDI->words[local_30];
      }
      else {
        in_RDI->words[local_30] = local_20 & -1L << ((byte)in_ESI & 0x3f);
        while (local_30 = local_30 + 1, local_30 < uVar1) {
          in_RDI->words[local_30] = local_20;
        }
        in_RDI->words[uVar1] = local_20 & 0xffffffffffffffffU >> (((byte)in_EDX ^ 0xff) + 1 & 0x3f);
      }
    }
    else {
      for (; local_34 < in_EDX; local_34 = in_CX + local_34) {
        bitset_container_add(in_RDI,(uint16_t)local_34);
      }
    }
  }
  return;
}

Assistant:

void bitset_container_add_from_range(bitset_container_t *bitset, uint32_t min,
                                     uint32_t max, uint16_t step) {
    if (step == 0) return;   // refuse to crash
    if ((64 % step) == 0) {  // step divides 64
        uint64_t mask = 0;   // construct the repeated mask
        for (uint32_t value = (min % step); value < 64; value += step) {
            mask |= ((uint64_t)1 << value);
        }
        uint32_t firstword = min / 64;
        uint32_t endword = (max - 1) / 64;
        bitset->cardinality = (max - min + step - 1) / step;
        if (firstword == endword) {
            bitset->words[firstword] |=
                mask & (((~UINT64_C(0)) << (min % 64)) &
                        ((~UINT64_C(0)) >> ((~max + 1) % 64)));
            return;
        }
        bitset->words[firstword] = mask & ((~UINT64_C(0)) << (min % 64));
        for (uint32_t i = firstword + 1; i < endword; i++)
            bitset->words[i] = mask;
        bitset->words[endword] = mask & ((~UINT64_C(0)) >> ((~max + 1) % 64));
    } else {
        for (uint32_t value = min; value < max; value += step) {
            bitset_container_add(bitset, value);
        }
    }
}